

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

int armci_check_contiguous(int *src_stride,int *dst_stride,int *count,int n_stride)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int local_58 [6];
  int dst_ld [7];
  int src_ld [7];
  
  dst_ld[2] = *src_stride;
  local_58[0] = *dst_stride;
  iVar11 = *src_stride;
  iVar9 = *dst_stride;
  for (lVar8 = 1; lVar8 < n_stride; lVar8 = lVar8 + 1) {
    iVar1 = src_stride[lVar8];
    dst_ld[lVar8 + 2] = iVar1 / iVar11;
    iVar2 = dst_stride[lVar8];
    local_58[lVar8] = iVar2 / iVar9;
    iVar11 = iVar1;
    iVar9 = iVar2;
  }
  uVar7 = 0;
  uVar10 = 0;
  if (0 < n_stride) {
    uVar10 = (ulong)(uint)n_stride;
  }
  bVar4 = true;
  bVar3 = false;
  uVar6 = 0;
  do {
    if (uVar10 == uVar7) {
      uVar6 = 1;
      bVar4 = bVar3;
LAB_00152367:
      if ((((long)n_stride <= (long)uVar7) && (0 < n_stride)) && (bVar4)) {
        uVar6 = (uint)(count[(uint)n_stride] == 1);
      }
      return uVar6;
    }
    iVar11 = count[uVar7];
    if (iVar11 < dst_ld[uVar7 + 2]) {
      bVar5 = true;
      if (bVar3) {
        uVar6 = 0;
        goto LAB_00152367;
      }
    }
    else if ((iVar11 < local_58[uVar7] && bVar3) ||
            ((bVar5 = true, local_58[uVar7] <= iVar11 || bVar3 &&
             (bVar5 = bVar3, iVar11 != 1 && bVar3)))) goto LAB_00152367;
    bVar3 = bVar5;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int armci_check_contiguous(int *src_stride, int *dst_stride,
    int *count, int n_stride)
{
#if 1
  /* This is code from the merge between CMX and the current develop branch
   * (2018/7/5) */
  int i;
  int ret = 1;
  int stridelen = 1;
  int gap = 0;
  int src_ld[7], dst_ld[7];
  /**
   * Calculate physical dimensions of buffers from stride arrays
   */
  src_ld[0] = src_stride[0];
  dst_ld[0] = dst_stride[0];
  for (i=1; i<n_stride; i++) {
    src_ld[i] = src_stride[i]/src_stride[i-1];
    dst_ld[i] = dst_stride[i]/dst_stride[i-1];
  }
  /* NOTE: The count array contains the length of the final dimension and can
   * be used to evaluate some corner cases
   */
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if ((count[i] < src_ld[i] || count[i] < dst_ld[i])
        && gap == 1) {
      /* Data is definitely strided in memory */
      ret = 0;
      break;
    } else if ((count[i] < src_ld[i] || count[i] < dst_ld[i]) &&
        gap == 0) {
      /* First dimension that doesn't match physical dimension */
      gap = 1;
    } else if (count[i] != 1 && gap == 1) {
      /* Found a mismatch between requested block and physical dimensions
       * indicating a possible stride in memory
       * */
      ret = 0;
      break;
    }
  }
  /**
   * Everything looks good up to this point but need to verify that last
   * dimension is 1 if a mismatch between requested block and physical
   * array dimensions has been found previously
   */
  if (gap == 1 && ret == 1 && n_stride > 0) {
    if (count[n_stride] != 1) ret = 0;
  }
  return ret;
#else
  int i;
  int ret = 1;
  int stridelen = 1;
  /* NOTE: The count array contains the length of the final dimension and could
   * be used to evaluate some corner cases that are not picked up by this
   * algorithm
   */ 
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if (stridelen < src_stride[i] || stridelen < dst_stride[i]) {
      ret = 0;
      break;
    }
  }
  return ret;
#endif
}